

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Minefield_Data_PDU.cpp
# Opt level: O0

KBOOL __thiscall
KDIS::PDU::Minefield_Data_PDU::operator==(Minefield_Data_PDU *this,Minefield_Data_PDU *Value)

{
  KBOOL KVar1;
  bool bVar2;
  Minefield_Data_PDU *Value_local;
  Minefield_Data_PDU *this_local;
  
  KVar1 = Minefield_Header::operator!=(&this->super_Minefield_Header,&Value->super_Minefield_Header)
  ;
  if (KVar1) {
    this_local._7_1_ = false;
  }
  else {
    KVar1 = DATA_TYPE::EntityIdentifier::operator!=(&this->m_ReqID,&Value->m_ReqID);
    if (KVar1) {
      this_local._7_1_ = false;
    }
    else if ((this->m_SeqNumUnion).m_ui16SeqNum == (Value->m_SeqNumUnion).m_ui16SeqNum) {
      if (this->m_ui8ReqID == Value->m_ui8ReqID) {
        if (this->m_ui8PduSeqNum == Value->m_ui8PduSeqNum) {
          if (this->m_ui8NumPdus == Value->m_ui8NumPdus) {
            if (this->m_ui8NumMines == Value->m_ui8NumMines) {
              if (this->m_ui8NumSensTyp == Value->m_ui8NumSensTyp) {
                KVar1 = DATA_TYPE::MinefieldDataFilter::operator!=
                                  (&this->m_DataFilter,&Value->m_DataFilter);
                if (KVar1) {
                  this_local._7_1_ = false;
                }
                else {
                  KVar1 = DATA_TYPE::EntityType::operator!=(&this->m_MineTyp,&Value->m_MineTyp);
                  if (KVar1) {
                    this_local._7_1_ = false;
                  }
                  else {
                    bVar2 = std::operator!=(&this->m_vui16SensorTypes,&Value->m_vui16SensorTypes);
                    if (bVar2) {
                      this_local._7_1_ = false;
                    }
                    else {
                      bVar2 = std::operator!=(&this->m_vMines,&Value->m_vMines);
                      if (bVar2) {
                        this_local._7_1_ = false;
                      }
                      else {
                        this_local._7_1_ = true;
                      }
                    }
                  }
                }
              }
              else {
                this_local._7_1_ = false;
              }
            }
            else {
              this_local._7_1_ = false;
            }
          }
          else {
            this_local._7_1_ = false;
          }
        }
        else {
          this_local._7_1_ = false;
        }
      }
      else {
        this_local._7_1_ = false;
      }
    }
    else {
      this_local._7_1_ = false;
    }
  }
  return this_local._7_1_;
}

Assistant:

KBOOL Minefield_Data_PDU::operator == ( const Minefield_Data_PDU & Value ) const
{
    if( Minefield_Header::operator  != ( Value ) )                          return false;
    if( m_ReqID                     != Value.m_ReqID )                      return false;
    if( m_SeqNumUnion.m_ui16SeqNum  != Value.m_SeqNumUnion.m_ui16SeqNum )   return false;
    if( m_ui8ReqID                  != Value.m_ui8ReqID )                   return false;
    if( m_ui8PduSeqNum              != Value.m_ui8PduSeqNum )               return false;
    if( m_ui8NumPdus                != Value.m_ui8NumPdus )                 return false;
    if( m_ui8NumMines               != Value.m_ui8NumMines )                return false;
    if( m_ui8NumSensTyp             != Value.m_ui8NumSensTyp )              return false;
    if( m_DataFilter                != Value.m_DataFilter )                 return false;
    if( m_MineTyp                   != Value.m_MineTyp )                    return false;
    if( m_vui16SensorTypes          != Value.m_vui16SensorTypes )           return false;
    if( m_vMines                    != Value.m_vMines )                     return false;
    return true;
}